

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qcheckedint_impl.h
# Opt level: O2

void __thiscall QRectF::QRectF(QRectF *this,QRect *r)

{
  undefined4 uVar1;
  undefined4 uVar2;
  
  uVar1 = r->x1;
  uVar2 = r->y1;
  this->xp = (double)(int)uVar1;
  this->yp = (double)(int)uVar2;
  this->w = (double)(((long)(r->x2).m_i - (long)(int)uVar1) + 1);
  this->h = (double)(((long)(r->y2).m_i - (long)(int)uVar2) + 1);
  return;
}

Assistant:

constexpr Int value() const noexcept { return m_i; }